

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O1

bool __thiscall GNUmakeTokenPoolPosix::ParseAuth(GNUmakeTokenPoolPosix *this,char *jobserver)

{
  int wfd;
  int rfd;
  
  __isoc99_sscanf(jobserver,"%*[^=]=%d,%d");
  return false;
}

Assistant:

bool GNUmakeTokenPoolPosix::ParseAuth(const char* jobserver) {
  int rfd = -1;
  int wfd = -1;
  if ((sscanf(jobserver, "%*[^=]=%d,%d", &rfd, &wfd) == 2) &&
      CheckFd(rfd) &&
      CheckFd(wfd) &&
      SetAlarmHandler()) {
    rfd_ = rfd;
    wfd_ = wfd;
    return true;
  }

  return false;
}